

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
          f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  wchar_t __tmp;
  ulong uVar10;
  int iVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  wchar_t *local_40;
  long local_38;
  
  uVar7 = (ulong)spec->width_;
  uVar8 = uVar7 - size;
  if (uVar7 < size || uVar8 == 0) {
    puVar2 = *(undefined8 **)this;
    lVar9 = puVar2[2];
    uVar7 = size + lVar9;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    local_40 = (wchar_t *)(lVar9 * 4 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                  *)&f,&local_40);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar9 = puVar2[2];
    uVar10 = lVar9 + uVar7;
    if ((ulong)puVar2[3] < uVar10) {
      local_38 = lVar9;
      (**(code **)*puVar2)(puVar2,uVar10);
      lVar9 = local_38;
    }
    puVar2[2] = uVar10;
    auVar6 = _DAT_00138020;
    auVar5 = _DAT_00138010;
    auVar4 = _DAT_00137010;
    lVar3 = puVar2[1];
    local_40 = (wchar_t *)(lVar3 + lVar9 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar10 = uVar8 >> 1;
      if (1 < uVar8) {
        local_40 = local_40 + uVar10;
        uVar8 = uVar10 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        lVar3 = lVar3 + lVar9 * 4;
        lVar9 = 0;
        auVar21 = auVar21 ^ _DAT_00137010;
        do {
          auVar18._8_4_ = (int)lVar9;
          auVar18._0_8_ = lVar9;
          auVar18._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar22 = (auVar18 | auVar6) ^ auVar4;
          iVar16 = auVar21._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar16 && auVar21._0_4_ < auVar22._0_4_ ||
                      iVar16 < auVar22._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar9 * 4) = wVar1;
          }
          if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
              auVar22._12_4_ <= auVar21._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar9 * 4) = wVar1;
          }
          auVar18 = (auVar18 | auVar5) ^ auVar4;
          iVar23 = auVar18._4_4_;
          if (iVar23 <= iVar16 && (iVar23 != iVar16 || auVar18._0_4_ <= auVar21._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar9 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar9 * 4) = wVar1;
          }
          lVar9 = lVar9 + 4;
        } while ((uVar8 - ((uint)(uVar10 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                    *)&f,&local_40);
      auVar6 = _DAT_00138020;
      auVar5 = _DAT_00138010;
      auVar4 = _DAT_00137010;
      uVar8 = (uVar7 * 4 + (uVar10 + size) * -4) - 4;
      auVar22._8_4_ = (int)uVar8;
      auVar22._0_8_ = uVar8;
      auVar22._12_4_ = (int)(uVar8 >> 0x20);
      auVar13._0_8_ = uVar8 >> 2;
      auVar13._8_8_ = auVar22._8_8_ >> 2;
      uVar7 = 0;
      auVar13 = auVar13 ^ _DAT_00137010;
      do {
        auVar19._8_4_ = (int)uVar7;
        auVar19._0_8_ = uVar7;
        auVar19._12_4_ = (int)(uVar7 >> 0x20);
        auVar21 = (auVar19 | auVar6) ^ auVar4;
        iVar16 = auVar13._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar16 && auVar13._0_4_ < auVar21._0_4_ ||
                    iVar16 < auVar21._4_4_) & 1)) {
          local_40[uVar7] = wVar1;
        }
        if ((auVar21._12_4_ != auVar13._12_4_ || auVar21._8_4_ <= auVar13._8_4_) &&
            auVar21._12_4_ <= auVar13._12_4_) {
          local_40[uVar7 + 1] = wVar1;
        }
        auVar21 = (auVar19 | auVar5) ^ auVar4;
        iVar23 = auVar21._4_4_;
        if (iVar23 <= iVar16 && (iVar23 != iVar16 || auVar21._0_4_ <= auVar13._0_4_)) {
          local_40[uVar7 + 2] = wVar1;
          local_40[uVar7 + 3] = wVar1;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar8 >> 2) + 4 & 0x7ffffffffffffffc) != uVar7);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      local_40 = local_40 + uVar8;
      uVar8 = (uVar7 * 4 + size * -4) - 4;
      auVar11._8_4_ = (int)uVar8;
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = (int)(uVar8 >> 0x20);
      auVar12._0_8_ = uVar8 >> 2;
      auVar12._8_8_ = auVar11._8_8_ >> 2;
      lVar3 = lVar3 + lVar9 * 4;
      uVar7 = 0;
      auVar12 = auVar12 ^ _DAT_00137010;
      do {
        auVar17._8_4_ = (int)uVar7;
        auVar17._0_8_ = uVar7;
        auVar17._12_4_ = (int)(uVar7 >> 0x20);
        auVar21 = (auVar17 | auVar6) ^ auVar4;
        iVar16 = auVar12._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar16 && auVar12._0_4_ < auVar21._0_4_ ||
                    iVar16 < auVar21._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar7 * 4) = wVar1;
        }
        if ((auVar21._12_4_ != auVar12._12_4_ || auVar21._8_4_ <= auVar12._8_4_) &&
            auVar21._12_4_ <= auVar12._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar7 * 4) = wVar1;
        }
        auVar21 = (auVar17 | auVar5) ^ auVar4;
        iVar23 = auVar21._4_4_;
        if (iVar23 <= iVar16 && (iVar23 != iVar16 || auVar21._0_4_ <= auVar12._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar7 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar7 * 4) = wVar1;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar8 >> 2) + 4 & 0x7ffffffffffffffc) != uVar7);
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                    *)&f,&local_40);
    }
    else {
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                    *)&f,&local_40);
      auVar6 = _DAT_00138020;
      auVar5 = _DAT_00138010;
      auVar4 = _DAT_00137010;
      uVar8 = (uVar7 * 4 + size * -4) - 4;
      auVar14._8_4_ = (int)uVar8;
      auVar14._0_8_ = uVar8;
      auVar14._12_4_ = (int)(uVar8 >> 0x20);
      auVar15._0_8_ = uVar8 >> 2;
      auVar15._8_8_ = auVar14._8_8_ >> 2;
      uVar7 = 0;
      auVar15 = auVar15 ^ _DAT_00137010;
      do {
        auVar20._8_4_ = (int)uVar7;
        auVar20._0_8_ = uVar7;
        auVar20._12_4_ = (int)(uVar7 >> 0x20);
        auVar21 = (auVar20 | auVar6) ^ auVar4;
        iVar16 = auVar15._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar16 && auVar15._0_4_ < auVar21._0_4_ ||
                    iVar16 < auVar21._4_4_) & 1)) {
          local_40[uVar7] = wVar1;
        }
        if ((auVar21._12_4_ != auVar15._12_4_ || auVar21._8_4_ <= auVar15._8_4_) &&
            auVar21._12_4_ <= auVar15._12_4_) {
          local_40[uVar7 + 1] = wVar1;
        }
        auVar21 = (auVar20 | auVar5) ^ auVar4;
        iVar23 = auVar21._4_4_;
        if (iVar23 <= iVar16 && (iVar23 != iVar16 || auVar21._0_4_ <= auVar15._0_4_)) {
          local_40[uVar7 + 2] = wVar1;
          local_40[uVar7 + 3] = wVar1;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar8 >> 2) + 4 & 0x7ffffffffffffffc) != uVar7);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}